

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

void __thiscall
TwoStageDynamicBayesianNetwork::ComputeWithinNextStageClosure
          (TwoStageDynamicBayesianNetwork *this,Scope *Y,Scope *O)

{
  uint uVar1;
  bool bVar2;
  const_reference pvVar3;
  uint *puVar4;
  bool bVar5;
  Index *pIVar6;
  uint *puVar7;
  
  do {
    puVar4 = (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar5 = true;
    for (puVar7 = (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1) {
      pvVar3 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_YSoI_Y,(ulong)*puVar7);
      for (pIVar6 = (pvVar3->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pIVar6 != (pvVar3->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish; pIVar6 = pIVar6 + 1) {
        bVar2 = Scope::Contains(Y,*pIVar6);
        if (!bVar2) {
          Scope::Insert(Y,*pIVar6);
          bVar5 = false;
        }
      }
    }
    puVar7 = (O->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar4 = (O->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar7; puVar4 = puVar4 + 1) {
      uVar1 = *puVar4;
      pvVar3 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_YSoI_O,(ulong)uVar1);
      for (pIVar6 = (pvVar3->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pIVar6 != (pvVar3->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish; pIVar6 = pIVar6 + 1) {
        bVar2 = Scope::Contains(Y,*pIVar6);
        if (!bVar2) {
          Scope::Insert(Y,*pIVar6);
          bVar5 = false;
        }
      }
      pvVar3 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_OSoI_O,(ulong)uVar1);
      for (pIVar6 = (pvVar3->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pIVar6 != (pvVar3->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish; pIVar6 = pIVar6 + 1) {
        bVar2 = Scope::Contains(O,*pIVar6);
        if (!bVar2) {
          Scope::Insert(O,*pIVar6);
          bVar5 = false;
        }
      }
    }
  } while (!bVar5);
  return;
}

Assistant:

void TwoStageDynamicBayesianNetwork::
ComputeWithinNextStageClosure(Scope& Y, Scope& O) const
{    
    bool converged = true;
    do{
        converged = true;
        //check all Y for non-included Y dependencies
        Scope::const_iterator s_it = Y.begin();
        Scope::const_iterator s_last = Y.end();
        while(s_it != s_last)
        {
            Index yI = *s_it;
            const Scope& y_YSoI = _m_YSoI_Y.at(yI);
            for(Scope::const_iterator oy_it = y_YSoI.begin(); 
                    oy_it != y_YSoI.end(); oy_it++)
                //yI has other Y (oyI = *oy_it) that point to it...
                //let's see if they are in Y already.
                if(! Y.Contains( *oy_it ) )
                {
                    converged = false;
                    Y.Insert(*oy_it);
                }
            s_it++;
        }
        
        //check all O for non-included O and Y dependencies
        Scope::const_iterator o_it = O.begin();
        Scope::const_iterator o_last = O.end();
        while(o_it != o_last)
        {
            Index oI = *o_it;
            const Scope& o_YSoI = _m_YSoI_O.at(oI);
            for(Scope::const_iterator oy_it = o_YSoI.begin(); 
                oy_it != o_YSoI.end(); oy_it++)
                //oI has other Y (oyI = *oy_it) that point to it...
                //let's see if they are in Y already.
                if(! Y.Contains( *oy_it ) )
                {
                    converged = false;
                    Y.Insert(*oy_it);
                }

            const Scope& o_OSoI = _m_OSoI_O.at(oI);
            for(Scope::const_iterator oo_it = o_OSoI.begin(); 
                oo_it != o_OSoI.end(); oo_it++)
                //oI has other O (ooI = *oo_it) that point to it...
                //let's see if they are in O already.
                if(! O.Contains( *oo_it ) )
                {
                    converged = false;
                    O.Insert(*oo_it);
                }


            o_it++;
        }

    }while (! converged );
}